

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# randomvar.hpp
# Opt level: O2

void __thiscall MetaSim::RandomVar::MaxException::MaxException(MaxException *this,string *cl)

{
  allocator local_51;
  string local_50;
  string local_30;
  
  std::__cxx11::string::string
            ((string *)&local_30,"Maximum value cannot be computed for this variable type",&local_51
            );
  std::__cxx11::string::string((string *)&local_50,(string *)cl);
  Exc::Exc(&this->super_Exc,&local_30,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_30);
  *(undefined ***)&(this->super_Exc).super_BaseExc = &PTR__BaseExc_0012bcf0;
  return;
}

Assistant:

MaxException(std::string cl)
                :Exc("Maximum value cannot be computed for this variable type", cl) {}